

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

ByteData * __thiscall
cfd::core::ConfidentialTransaction::GetByteData
          (ByteData *__return_storage_ptr__,ConfidentialTransaction *this,bool has_witness)

{
  wally_tx_witness_stack *pwVar1;
  uchar *puVar2;
  wally_tx_output *pwVar3;
  wally_tx_witness_item *pwVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ByteData *pBVar9;
  uint32_t *puVar10;
  uint32_t *puVar11;
  ulong uVar12;
  ulong uVar13;
  CfdException *pCVar14;
  size_t *psVar15;
  uint uVar16;
  undefined7 in_register_00000011;
  ulong uVar17;
  byte bVar18;
  wally_tx_input *pwVar19;
  uint32_t flags;
  size_t max_size;
  ulong uVar20;
  size_type sVar21;
  uint uVar22;
  byte bVar23;
  uint8_t *result_1;
  undefined8 *puVar24;
  uint8_t *puVar25;
  size_t sVar26;
  uint8_t *result;
  undefined1 *puVar27;
  wally_tx *tx;
  int ret;
  size_t txsize;
  size_t size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  size_type local_a8;
  bool local_9d;
  int local_9c;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78;
  pointer local_70;
  size_t *local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  ulong local_48;
  ByteData *local_40;
  wally_tx *local_38;
  
  tx = (wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_;
  local_70 = (pointer)0x0;
  flags = (uint32_t)CONCAT71(in_register_00000011,has_witness);
  local_9d = has_witness;
  local_40 = __return_storage_ptr__;
  local_9c = wally_tx_get_length(tx,flags,(size_t *)&local_70);
  if (local_9c != 0) {
    local_98._0_8_ = "cfdcore_elements_transaction.cpp";
    local_98._8_4_ = 0xd98;
    local_88._M_allocated_capacity = 0x58a64f;
    logger::log<int&,bool&>
              ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,
               "wally_tx_get_length NG[{}]. wit[{}]",&local_9c,&local_9d);
    pCVar14 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = &local_88;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"tx length calc error.","")
    ;
    CfdException::CfdException(pCVar14,kCfdIllegalStateError,(string *)local_98);
    __cxa_throw(pCVar14,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_9c = 0;
  if (local_70 < (pointer)0xb) {
    local_9c = -2;
    local_98._0_8_ = "cfdcore_elements_transaction.cpp";
    local_98._8_4_ = 0xd9f;
    local_88._M_allocated_capacity = 0x58a64f;
    logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"tx size low.[{}]",
               (unsigned_long *)&local_70);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_60,(size_type)local_70,(allocator_type *)local_98);
  if (local_9c != -2) {
    local_98._0_8_ = local_70;
    local_9c = wally_tx_to_bytes(tx,flags,local_60.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                 (long)local_60.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_60.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,(size_t *)local_98)
    ;
    if (local_9c == 0) goto LAB_00479c33;
    if (local_9c != -2) {
      local_98._0_8_ = "cfdcore_elements_transaction.cpp";
      local_98._8_4_ = 0xe89;
      local_88._M_allocated_capacity = 0x58a64f;
      logger::log<int&>((CfdSourceLocation *)local_98,kCfdLogLevelWarning,
                        "wally_tx_to_bytes NG[{}].",&local_9c);
      pCVar14 = (CfdException *)__cxa_allocate_exception(0x30);
      local_98._0_8_ = &local_88;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"tx hex convert error.","");
      CfdException::CfdException(pCVar14,kCfdIllegalStateError,(string *)local_98);
      __cxa_throw(pCVar14,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  local_68 = &tx->num_inputs;
  if ((tx->num_inputs != 0) && (tx->num_outputs != 0)) {
    local_98._0_8_ = "cfdcore_elements_transaction.cpp";
    local_98._8_4_ = 0xe84;
    local_88._M_allocated_capacity = 0x58a64f;
    logger::log<int&,unsigned_long&,unsigned_long&>
              ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,
               "wally_tx_to_bytes NG[{}]. in/out={}/{}",&local_9c,local_68,&tx->num_outputs);
    pCVar14 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = &local_88;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"tx hex convert error.","")
    ;
    CfdException::CfdException(pCVar14,kCfdIllegalStateError,(string *)local_98);
    __cxa_throw(pCVar14,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_98._0_8_ = "cfdcore_elements_transaction.cpp";
  local_98._8_4_ = 0xdaf;
  local_88._M_allocated_capacity = 0x58a64f;
  logger::log<unsigned_long&>
            ((CfdSourceLocation *)local_98,kCfdLogLevelInfo,"wally_tx_get_length size[{}]",
             (unsigned_long *)&local_70);
  uVar13 = tx->num_inputs;
  uVar12 = tx->num_outputs;
  local_a8 = uVar13 * 0xd0 + uVar12 * 0x70 + 0x38;
  if (uVar13 != 0) {
    psVar15 = &tx->inputs->inflation_keys_len;
    uVar17 = 1;
    do {
      sVar21 = local_a8 + 0x40;
      if ((uchar *)psVar15[-3] != (uchar *)0x0) {
        sVar21 = psVar15[-2] + local_a8 + 0x4a;
      }
      local_a8 = sVar21;
      if ((uchar *)psVar15[-1] != (uchar *)0x0) {
        local_a8 = sVar21 + *psVar15 + 10;
      }
      psVar15 = psVar15 + 0x1a;
      bVar5 = uVar17 < uVar13;
      uVar17 = (ulong)((int)uVar17 + 1);
    } while (bVar5);
  }
  if (uVar12 != 0) {
    psVar15 = &tx->outputs->nonce_len;
    uVar17 = 1;
    do {
      if ((uchar *)psVar15[-5] != (uchar *)0x0) {
        local_a8 = local_a8 + psVar15[-4] + 10;
      }
      if ((uchar *)psVar15[-3] != (uchar *)0x0) {
        local_a8 = local_a8 + psVar15[-2] + 10;
      }
      if ((uchar *)psVar15[-1] != (uchar *)0x0) {
        local_a8 = local_a8 + *psVar15 + 10;
      }
      if ((uchar *)psVar15[-8] != (uchar *)0x0) {
        local_a8 = local_a8 + psVar15[-7] + 10;
      }
      local_a8 = local_a8 + 10;
      psVar15 = psVar15 + 0xe;
      bVar5 = uVar17 < uVar12;
      uVar17 = (ulong)((int)uVar17 + 1);
    } while (bVar5);
  }
  uVar17 = 0;
  if (uVar13 == 0) {
    bVar23 = 0;
  }
  else {
    pwVar19 = tx->inputs;
    bVar23 = 0;
    uVar16 = 0;
    do {
      if (pwVar19[uVar17].issuance_amount_rangeproof != (uchar *)0x0) {
        local_a8 = local_a8 + pwVar19[uVar17].issuance_amount_rangeproof_len + 10;
        uVar16 = 1;
      }
      if (pwVar19[uVar17].inflation_keys_rangeproof != (uchar *)0x0) {
        local_a8 = local_a8 + pwVar19[uVar17].inflation_keys_rangeproof_len + 10;
        uVar16 = 1;
      }
      pwVar1 = pwVar19[uVar17].witness;
      if ((pwVar1 != (wally_tx_witness_stack *)0x0) && (pwVar1->num_items != 0)) {
        psVar15 = &pwVar1->items->witness_len;
        uVar20 = 1;
        do {
          local_a8 = local_a8 + *psVar15 + 10;
          psVar15 = psVar15 + 2;
          bVar5 = uVar20 < pwVar1->num_items;
          uVar20 = (ulong)((int)uVar20 + 1);
        } while (bVar5);
        bVar23 = 1;
      }
      pwVar1 = pwVar19[uVar17].pegin_witness;
      if ((pwVar1 != (wally_tx_witness_stack *)0x0) && (pwVar1->num_items != 0)) {
        psVar15 = &pwVar1->items->witness_len;
        uVar22 = 1;
        do {
          local_a8 = local_a8 + *psVar15 + 10;
          uVar20 = (ulong)uVar22;
          psVar15 = psVar15 + 2;
          uVar22 = uVar22 + 1;
        } while (uVar20 < pwVar1->num_items);
        bVar23 = 1;
      }
      local_a8 = local_a8 + 10;
      uVar17 = (ulong)((int)uVar17 + 1);
    } while (uVar17 < uVar13);
    bVar23 = bVar23 | (byte)uVar16;
    uVar17 = (ulong)uVar16;
  }
  if (uVar12 == 0) {
    bVar18 = 0;
  }
  else {
    psVar15 = &tx->outputs->rangeproof_len;
    uVar16 = 1;
    bVar18 = 0;
    do {
      if ((uchar *)psVar15[-3] != (uchar *)0x0) {
        local_a8 = local_a8 + psVar15[-2] + 10;
        bVar18 = 1;
      }
      if ((uchar *)psVar15[-1] != (uchar *)0x0) {
        local_a8 = local_a8 + *psVar15 + 10;
        bVar18 = 1;
      }
      local_a8 = local_a8 + 10;
      uVar13 = (ulong)uVar16;
      psVar15 = psVar15 + 0xe;
      uVar16 = uVar16 + 1;
    } while (uVar13 < uVar12);
  }
  if ((ulong)((long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) < local_a8) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_60,local_a8);
    local_98._0_8_ = "cfdcore_elements_transaction.cpp";
    local_98._8_4_ = 0xdf8;
    local_88._M_allocated_capacity = 0x58a64f;
    logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_98,kCfdLogLevelInfo,"buffer.resize[{}]",&local_a8);
  }
  *(uint32_t *)
   local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = tx->version;
  bVar23 = (bVar23 | bVar18) & (tx->version >> 0x1e & 1) == 0;
  *(byte *)((long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start + 4) = bVar23;
  puVar10 = (uint32_t *)
            AbstractTransaction::CopyVariableInt
                      (tx->num_inputs,
                       (uint8_t *)
                       ((long)local_60.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 5));
  local_48 = (ulong)bVar23;
  if (*local_68 != 0) {
    uVar13 = 0;
    uVar12 = 1;
    local_38 = tx;
    do {
      pwVar19 = tx->inputs;
      uVar16 = pwVar19[uVar13].index;
      if ((pwVar19[uVar13].pegin_witness != (wally_tx_witness_stack *)0x0) &&
         ((pwVar19[uVar13].pegin_witness)->num_items != 0)) {
        uVar16 = uVar16 | 0x40000000;
      }
      pwVar19 = pwVar19 + uVar13;
      if ((pwVar19->issuance_amount != (uchar *)0x0) && (pwVar19->issuance_amount_len != 0)) {
        uVar16 = uVar16 | 0x80000000;
      }
      uVar6 = *(undefined8 *)pwVar19->txhash;
      uVar7 = *(undefined8 *)(pwVar19->txhash + 8);
      uVar8 = *(undefined8 *)(pwVar19->txhash + 0x18);
      *(undefined8 *)(puVar10 + 4) = *(undefined8 *)(pwVar19->txhash + 0x10);
      *(undefined8 *)(puVar10 + 6) = uVar8;
      *(undefined8 *)puVar10 = uVar6;
      *(undefined8 *)(puVar10 + 2) = uVar7;
      puVar10[8] = uVar16;
      puVar11 = (uint32_t *)
                AbstractTransaction::CopyVariableBuffer
                          (pwVar19->script,pwVar19->script_len,(uint8_t *)(puVar10 + 9));
      *puVar11 = pwVar19->sequence;
      puVar10 = puVar11 + 1;
      if (uVar17 != 0) {
        uVar6 = *(undefined8 *)pwVar19->blinding_nonce;
        uVar7 = *(undefined8 *)(pwVar19->blinding_nonce + 8);
        uVar8 = *(undefined8 *)(pwVar19->blinding_nonce + 0x18);
        *(undefined8 *)(puVar11 + 5) = *(undefined8 *)(pwVar19->blinding_nonce + 0x10);
        *(undefined8 *)(puVar11 + 7) = uVar8;
        *(undefined8 *)puVar10 = uVar6;
        *(undefined8 *)(puVar11 + 3) = uVar7;
        uVar6 = *(undefined8 *)pwVar19->entropy;
        uVar7 = *(undefined8 *)(pwVar19->entropy + 8);
        uVar8 = *(undefined8 *)(pwVar19->entropy + 0x18);
        *(undefined8 *)(puVar11 + 0xd) = *(undefined8 *)(pwVar19->entropy + 0x10);
        *(undefined8 *)(puVar11 + 0xf) = uVar8;
        *(undefined8 *)(puVar11 + 9) = uVar6;
        *(undefined8 *)(puVar11 + 0xb) = uVar7;
        puVar2 = pwVar19->issuance_amount;
        uVar13 = pwVar19->issuance_amount_len;
        if (uVar13 == 0 || puVar2 == (uchar *)0x0) {
LAB_004797f4:
          *(undefined1 *)(puVar11 + 0x11) = 0;
          puVar27 = (undefined1 *)((long)puVar11 + 0x45);
        }
        else {
          if (*puVar2 == '\x01') {
            uVar20 = 9;
          }
          else {
            uVar20 = 0x21;
            if (*puVar2 == '\0') goto LAB_004797f4;
          }
          if (uVar20 < uVar13) {
            uVar13 = uVar20;
          }
          local_88._M_allocated_capacity = 0;
          local_88._8_8_ = 0;
          local_98._0_8_ = (pointer)0x0;
          local_98._8_8_ = 0;
          local_78 = 0;
          memcpy(local_98,puVar2,uVar13);
          tx = local_38;
          memcpy(puVar11 + 0x11,local_98,uVar20);
          puVar27 = (undefined1 *)((long)(puVar11 + 0x11) + uVar20);
        }
        puVar2 = pwVar19->inflation_keys;
        uVar13 = pwVar19->inflation_keys_len;
        if (uVar13 == 0 || puVar2 == (uchar *)0x0) {
LAB_00479873:
          *puVar27 = 0;
          puVar10 = (uint32_t *)(puVar27 + 1);
        }
        else {
          if (*puVar2 == '\x01') {
            uVar20 = 9;
          }
          else {
            uVar20 = 0x21;
            if (*puVar2 == '\0') goto LAB_00479873;
          }
          if (uVar20 < uVar13) {
            uVar13 = uVar20;
          }
          local_88._M_allocated_capacity = 0;
          local_88._8_8_ = 0;
          local_98._0_8_ = (pointer)0x0;
          local_98._8_8_ = 0;
          local_78 = 0;
          memcpy(local_98,puVar2,uVar13);
          memcpy(puVar27,local_98,uVar20);
          puVar10 = (uint32_t *)(puVar27 + uVar20);
        }
      }
      bVar5 = uVar12 < *local_68;
      uVar13 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar5);
  }
  puVar10 = (uint32_t *)AbstractTransaction::CopyVariableInt(tx->num_outputs,(uint8_t *)puVar10);
  if (tx->num_outputs != 0) {
    uVar13 = 0;
    uVar12 = 1;
    do {
      pwVar3 = tx->outputs;
      puVar2 = pwVar3[uVar13].asset;
      uVar17 = pwVar3[uVar13].asset_len;
      if ((uVar17 == 0 || puVar2 == (uchar *)0x0) || (*puVar2 == '\0')) {
        *(undefined1 *)puVar10 = 0;
        puVar27 = (undefined1 *)((long)puVar10 + 1);
      }
      else {
        if (0x20 < uVar17) {
          uVar17 = 0x21;
        }
        local_88._M_allocated_capacity = 0;
        local_88._8_8_ = 0;
        local_98._0_8_ = (pointer)0x0;
        local_98._8_8_ = 0;
        local_78 = 0;
        memcpy(local_98,puVar2,uVar17);
        *(undefined8 *)puVar10 = local_98._0_8_;
        *(undefined8 *)(puVar10 + 2) = local_98._8_8_;
        *(size_type *)(puVar10 + 4) = local_88._M_allocated_capacity;
        *(undefined8 *)(puVar10 + 6) = local_88._8_8_;
        *(undefined1 *)(puVar10 + 8) = local_78;
        puVar27 = (undefined1 *)((long)puVar10 + 0x21);
      }
      puVar2 = pwVar3[uVar13].value;
      uVar17 = pwVar3[uVar13].value_len;
      if (uVar17 == 0 || puVar2 == (uchar *)0x0) {
LAB_0047999d:
        *puVar27 = 0;
        puVar24 = (undefined8 *)(puVar27 + 1);
      }
      else {
        if (*puVar2 == '\x01') {
          uVar20 = 9;
        }
        else {
          uVar20 = 0x21;
          if (*puVar2 == '\0') goto LAB_0047999d;
        }
        if (uVar20 < uVar17) {
          uVar17 = uVar20;
        }
        local_88._M_allocated_capacity = 0;
        local_88._8_8_ = 0;
        local_98._0_8_ = (pointer)0x0;
        local_98._8_8_ = 0;
        local_78 = 0;
        memcpy(local_98,puVar2,uVar17);
        memcpy(puVar27,local_98,uVar20);
        puVar24 = (undefined8 *)(puVar27 + uVar20);
      }
      puVar2 = pwVar3[uVar13].nonce;
      uVar17 = pwVar3[uVar13].nonce_len;
      if ((uVar17 == 0 || puVar2 == (uchar *)0x0) || (*puVar2 == '\0')) {
        *(undefined1 *)puVar24 = 0;
        puVar25 = (uint8_t *)((long)puVar24 + 1);
      }
      else {
        if (0x20 < uVar17) {
          uVar17 = 0x21;
        }
        local_88._M_allocated_capacity = 0;
        local_88._8_8_ = 0;
        local_98._0_8_ = (pointer)0x0;
        local_98._8_8_ = 0;
        local_78 = 0;
        memcpy(local_98,puVar2,uVar17);
        *puVar24 = local_98._0_8_;
        puVar24[1] = local_98._8_8_;
        puVar24[2] = local_88._M_allocated_capacity;
        puVar24[3] = local_88._8_8_;
        *(undefined1 *)(puVar24 + 4) = local_78;
        puVar25 = (uint8_t *)((long)puVar24 + 0x21);
      }
      puVar10 = (uint32_t *)
                AbstractTransaction::CopyVariableBuffer
                          (pwVar3[uVar13].script,pwVar3[uVar13].script_len,puVar25);
      bVar5 = uVar12 < tx->num_outputs;
      uVar13 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar5);
  }
  *puVar10 = tx->locktime;
  puVar10 = puVar10 + 1;
  if ((char)local_48 != '\0') {
    if (*local_68 != 0) {
      uVar13 = 0;
      do {
        pwVar19 = tx->inputs;
        puVar25 = AbstractTransaction::CopyVariableBuffer
                            (pwVar19[uVar13].issuance_amount_rangeproof,
                             pwVar19[uVar13].issuance_amount_rangeproof_len,(uint8_t *)puVar10);
        puVar25 = AbstractTransaction::CopyVariableBuffer
                            (pwVar19[uVar13].inflation_keys_rangeproof,
                             pwVar19[uVar13].inflation_keys_rangeproof_len,puVar25);
        if (pwVar19[uVar13].witness == (wally_tx_witness_stack *)0x0) {
          sVar26 = 0;
        }
        else {
          sVar26 = (pwVar19[uVar13].witness)->num_items;
        }
        puVar25 = AbstractTransaction::CopyVariableInt(sVar26,puVar25);
        if (sVar26 != 0) {
          uVar12 = 0;
          uVar17 = 1;
          do {
            pwVar4 = (pwVar19[uVar13].witness)->items;
            puVar25 = AbstractTransaction::CopyVariableBuffer
                                (pwVar4[uVar12].witness,pwVar4[uVar12].witness_len,puVar25);
            bVar5 = uVar17 < sVar26;
            uVar12 = uVar17;
            uVar17 = (ulong)((int)uVar17 + 1);
          } while (bVar5);
        }
        if (pwVar19[uVar13].pegin_witness == (wally_tx_witness_stack *)0x0) {
          sVar26 = 0;
        }
        else {
          sVar26 = (pwVar19[uVar13].pegin_witness)->num_items;
        }
        puVar10 = (uint32_t *)AbstractTransaction::CopyVariableInt(sVar26,puVar25);
        if (sVar26 != 0) {
          uVar12 = 0;
          uVar17 = 1;
          do {
            pwVar4 = (pwVar19[uVar13].pegin_witness)->items;
            puVar10 = (uint32_t *)
                      AbstractTransaction::CopyVariableBuffer
                                (pwVar4[uVar12].witness,pwVar4[uVar12].witness_len,
                                 (uint8_t *)puVar10);
            bVar5 = uVar17 < sVar26;
            uVar12 = uVar17;
            uVar17 = (ulong)((int)uVar17 + 1);
          } while (bVar5);
        }
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (uVar13 < *local_68);
    }
    if (tx->num_outputs != 0) {
      uVar13 = 0;
      uVar12 = 1;
      do {
        pwVar3 = tx->outputs;
        puVar25 = AbstractTransaction::CopyVariableBuffer
                            (pwVar3[uVar13].surjectionproof,pwVar3[uVar13].surjectionproof_len,
                             (uint8_t *)puVar10);
        puVar10 = (uint32_t *)
                  AbstractTransaction::CopyVariableBuffer
                            (pwVar3[uVar13].rangeproof,pwVar3[uVar13].rangeproof_len,puVar25);
        bVar5 = uVar12 < tx->num_outputs;
        uVar13 = uVar12;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (bVar5);
    }
  }
  local_70 = (pointer)((long)puVar10 -
                      (long)local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  if (local_70 <
      local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish +
      -(long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&local_60,(size_type)local_70);
    local_98._0_8_ = "cfdcore_elements_transaction.cpp";
    local_98._8_4_ = 0xe80;
    local_88._M_allocated_capacity = 0x58a64f;
    logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_98,kCfdLogLevelInfo,"set buffer size[{}]",
               (unsigned_long *)&local_70);
  }
LAB_00479c33:
  pBVar9 = local_40;
  ByteData::ByteData(local_40,&local_60);
  if ((uint32_t *)
      local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return pBVar9;
}

Assistant:

ByteData ConfidentialTransaction::GetByteData(bool has_witness) const {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  size_t size = 0;
  uint32_t flag = 0;
  if (has_witness) {
    flag = WALLY_TX_FLAG_USE_WITNESS;
  }

  int ret = wally_tx_get_length(tx_pointer, flag, &size);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_get_length NG[{}]. wit[{}]", ret,
        has_witness);
    throw CfdException(kCfdIllegalStateError, "tx length calc error.");
  }
  // info(CFD_LOG_SOURCE, "wally_tx_get_length size[{}]", size);
  if (size < kElementsTransactionMinimumSize) {
    ret = WALLY_EINVAL;
    warn(CFD_LOG_SOURCE, "tx size low.[{}]", size);
  }
  std::vector<uint8_t> buffer(size);
  if (ret != WALLY_EINVAL) {
    size_t txsize = size;
    // flag |= WALLY_TX_FLAG_USE_ELEMENTS;
    ret = wally_tx_to_bytes(
        tx_pointer, flag, buffer.data(), buffer.size(), &txsize);
  }
  if (ret == WALLY_EINVAL) {
    /* About conversion with object.
     * In libwally, txin / txout does not allow empty data.
     * Therefore, if txin / txout is empty, object to byte is an error.
     * Therefore, it performs its own processing under certain circumstances.
     */
    if ((tx_pointer->num_inputs == 0) || (tx_pointer->num_outputs == 0)) {
      info(CFD_LOG_SOURCE, "wally_tx_get_length size[{}]", size);
      bool has_txin_witness = false;
      bool has_txin_rangeproof = false;
      bool has_txout_witness = false;
      bool is_witness = false;
      // Necessary size calculation because wally_tx_get_length may be
      // an invalid value (reserved more)
      size_t need_size = sizeof(struct wally_tx);
      need_size += tx_pointer->num_inputs * sizeof(struct wally_tx_input);
      need_size += tx_pointer->num_outputs * sizeof(struct wally_tx_output);
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        need_size += sizeof(input->blinding_nonce);
        need_size += sizeof(input->entropy);
        if (input->issuance_amount) {
          need_size += input->issuance_amount_len + 10;
        }
        if (input->inflation_keys) {
          need_size += input->inflation_keys_len + 10;
        }
      }
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        if (output->asset) need_size += output->asset_len + 10;
        if (output->value) need_size += output->value_len + 10;
        if (output->nonce) need_size += output->nonce_len + 10;
        if (output->script) need_size += output->script_len + 10;
        need_size += 10;
      }
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        // issuance amount range proof
        if (input->issuance_amount_rangeproof) {
          need_size += input->issuance_amount_rangeproof_len + 10;
          has_txin_rangeproof = true;
        }
        // inflation keys range proof
        if (input->inflation_keys_rangeproof) {
          need_size += input->inflation_keys_rangeproof_len + 10;
          has_txin_rangeproof = true;
        }
        // witness
        size_t num_items = input->witness ? input->witness->num_items : 0;
        for (uint32_t j = 0; j < num_items; ++j) {
          const struct wally_tx_witness_item *stack;
          stack = input->witness->items + j;
          need_size += stack->witness_len + 10;
          has_txin_witness = true;
        }
        // pegin_witness
        num_items = input->pegin_witness ? input->pegin_witness->num_items : 0;
        for (uint32_t j = 0; j < num_items; ++j) {
          const struct wally_tx_witness_item *stack;
          stack = input->pegin_witness->items + j;
          need_size += stack->witness_len + 10;
          has_txin_witness = true;
        }
        need_size += 10;
      }
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        if (output->surjectionproof) {
          need_size += output->surjectionproof_len + 10;
          has_txout_witness = true;
        }
        if (output->rangeproof) {
          need_size += output->rangeproof_len + 10;
          has_txout_witness = true;
        }
        need_size += 10;
      }
      if (need_size > buffer.size()) {
        buffer.resize(need_size);
        info(CFD_LOG_SOURCE, "buffer.resize[{}]", need_size);
      }

      uint8_t *address_pointer = buffer.data();
      memcpy(
          address_pointer, &tx_pointer->version, sizeof(tx_pointer->version));
      address_pointer += sizeof(tx_pointer->version);
      uint8_t witness_flag = 0;
      if ((tx_pointer->version & kTransactionVersionNoWitness) == 0) {
        if (has_txin_witness || has_txin_rangeproof || has_txout_witness) {
          is_witness = true;
          witness_flag = 1;
        }
      }
      *address_pointer = witness_flag;
      ++address_pointer;

      // txin
      address_pointer =
          CopyVariableInt(tx_pointer->num_inputs, address_pointer);
      uint32_t temp_index;
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        temp_index = input->index;
        if (input->pegin_witness && (input->pegin_witness->num_items > 0)) {
          temp_index |= static_cast<uint32_t>(WALLY_TX_PEGIN_FLAG);
        }
        if (input->issuance_amount && (input->issuance_amount_len > 0)) {
          temp_index |= static_cast<uint32_t>(WALLY_TX_ISSUANCE_FLAG);
        }
        memcpy(address_pointer, input->txhash, sizeof(input->txhash));
        address_pointer += sizeof(input->txhash);
        memcpy(address_pointer, &temp_index, sizeof(temp_index));
        address_pointer += sizeof(temp_index);
        address_pointer = CopyVariableBuffer(
            input->script, input->script_len, address_pointer);
        memcpy(address_pointer, &input->sequence, sizeof(input->sequence));
        address_pointer += sizeof(input->sequence);
        if (has_txin_rangeproof) {
          // blinding_nonce
          memcpy(
              address_pointer, &input->blinding_nonce,
              sizeof(input->blinding_nonce));
          address_pointer += sizeof(input->blinding_nonce);
          // entropy
          memcpy(address_pointer, &input->entropy, sizeof(input->entropy));
          address_pointer += sizeof(input->entropy);
          // issuance amount
          address_pointer = CopyConfidentialCommitment(
              input->issuance_amount, input->issuance_amount_len,
              kConfidentialValueSize, address_pointer);
          // inflation keys
          address_pointer = CopyConfidentialCommitment(
              input->inflation_keys, input->inflation_keys_len,
              kConfidentialValueSize, address_pointer);
        }
      }

      // txout
      address_pointer =
          CopyVariableInt(tx_pointer->num_outputs, address_pointer);
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        // asset (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->asset, output->asset_len, kConfidentialDataSize,
            address_pointer);
        // value (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->value, output->value_len, kConfidentialValueSize,
            address_pointer);
        // nonce (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->nonce, output->nonce_len, kConfidentialDataSize,
            address_pointer);
        // script
        address_pointer = CopyVariableBuffer(
            output->script, output->script_len, address_pointer);
      }

      // locktime
      memcpy(
          address_pointer, &tx_pointer->locktime,
          sizeof(tx_pointer->locktime));
      address_pointer += sizeof(tx_pointer->locktime);

      // witness
      if (is_witness) {
        for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
          const struct wally_tx_input *input = tx_pointer->inputs + i;
          // issuance amount range proof
          address_pointer = CopyVariableBuffer(
              input->issuance_amount_rangeproof,
              input->issuance_amount_rangeproof_len, address_pointer);
          // inflation keys range proof
          address_pointer = CopyVariableBuffer(
              input->inflation_keys_rangeproof,
              input->inflation_keys_rangeproof_len, address_pointer);
          // witness
          size_t num_items = input->witness ? input->witness->num_items : 0;
          address_pointer = CopyVariableInt(num_items, address_pointer);
          for (uint32_t j = 0; j < num_items; ++j) {
            const struct wally_tx_witness_item *stack;
            stack = input->witness->items + j;
            address_pointer = CopyVariableBuffer(
                stack->witness, stack->witness_len, address_pointer);
          }
          // pegin_witness
          num_items = 0;
          if (input->pegin_witness)
            num_items = input->pegin_witness->num_items;
          address_pointer = CopyVariableInt(num_items, address_pointer);
          for (uint32_t j = 0; j < num_items; ++j) {
            const struct wally_tx_witness_item *stack;
            stack = input->pegin_witness->items + j;
            address_pointer = CopyVariableBuffer(
                stack->witness, stack->witness_len, address_pointer);
          }
        }

        for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
          const struct wally_tx_output *output = tx_pointer->outputs + i;
          // surjection proof
          address_pointer = CopyVariableBuffer(
              output->surjectionproof, output->surjectionproof_len,
              address_pointer);
          // range proof
          address_pointer = CopyVariableBuffer(
              output->rangeproof, output->rangeproof_len, address_pointer);
        }
      }

      unsigned char *start_address = buffer.data();
      size = address_pointer - start_address;
      if (buffer.size() > size) {
        buffer.resize(size);
        info(CFD_LOG_SOURCE, "set buffer size[{}]", size);
      }
    } else {
      warn(
          CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}]. in/out={}/{}", ret,
          tx_pointer->num_inputs, tx_pointer->num_outputs);
      throw CfdException(kCfdIllegalStateError, "tx hex convert error.");
    }
  } else if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "tx hex convert error.");
  }

  return ByteData(buffer);
}